

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QLocale __thiscall QLocale::collation(QLocale *this)

{
  QSystemLocale *pQVar1;
  QLocale *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  QVariant local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RSI->d).d.ptr)->m_data == &systemLocaleData) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = systemLocale();
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_40 = 2;
    (*pQVar1->_vptr_QSystemLocale[2])(&local_38,pQVar1,0x21);
    ::QVariant::toString((QString *)&local_78,&local_38);
    ::QVariant::~QVariant(&local_38);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      QLocale(this,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      goto LAB_002e310b;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QLocale(this,in_RSI);
LAB_002e310b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QLocale QLocale::collation() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::Collation).toString();
        if (!res.isEmpty())
            return QLocale(res);
    }
#endif
    return *this;
}